

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

FeatureOptions<wasm::SIMDReplaceOp> * __thiscall
wasm::Random::FeatureOptions<wasm::SIMDReplaceOp>::
add<wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp>
          (FeatureOptions<wasm::SIMDReplaceOp> *this,FeatureSet feature,SIMDReplaceOp option,
          SIMDReplaceOp rest,SIMDReplaceOp rest_1,SIMDReplaceOp rest_2,SIMDReplaceOp rest_3)

{
  mapped_type *this_00;
  FeatureOptions<wasm::SIMDReplaceOp> *pFVar1;
  key_type local_3c;
  SIMDReplaceOp local_38;
  FeatureSet feature_local;
  SIMDReplaceOp option_local;
  
  local_3c.features = feature.features;
  local_38 = option;
  feature_local.features = rest_2;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>_>_>_>
            ::operator[](&this->options,&local_3c);
  std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>::push_back
            (this_00,&local_38);
  pFVar1 = add<wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp>
                     (this,(FeatureSet)local_3c.features,rest,rest_1,feature_local.features,rest_3);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }